

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCheckingVisitor.cpp
# Opt level: O2

void __thiscall
TypeCheckingVisitor::Visit(TypeCheckingVisitor *this,ArrayAccessExpression *expression)

{
  int iVar1;
  int iVar2;
  mapped_type *pmVar3;
  NewScopeLayer *pNVar4;
  mapped_type *pmVar5;
  runtime_error *this_00;
  allocator<char> local_89;
  key_type local_88;
  string local_68;
  string local_48;
  
  iVar2 = TemplateVisitor<int>::Accept
                    ((TemplateVisitor<int> *)this,&expression->index_expression_->super_Node);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"int",&local_89);
  pmVar3 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->type_system_,&local_88);
  iVar1 = *pmVar3;
  std::__cxx11::string::~string((string *)&local_88);
  if (iVar2 == iVar1) {
    pNVar4 = this->current_layer_;
    std::__cxx11::string::string((string *)&local_48,(string *)&expression->array_indent_);
    Symbol::Symbol((Symbol *)&local_88,&local_48);
    pNVar4 = NewScopeLayer::GetArrayLayer(pNVar4,(Symbol *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string((string *)&local_68,(string *)&expression->array_indent_);
    Symbol::Symbol((Symbol *)&local_88,&local_68);
    pmVar5 = std::__detail::
             _Map_base<Symbol,_std::pair<const_Symbol,_int>,_std::allocator<std::pair<const_Symbol,_int>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_int>,_std::allocator<std::pair<const_Symbol,_int>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&pNVar4->symbol_types_,(key_type *)&local_88);
    (this->super_TemplateVisitor<int>).tos_value_ = *pmVar5 + -1;
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Non-int type expression in index");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void TypeCheckingVisitor::Visit(ArrayAccessExpression* expression) {
  int type_code = Accept(expression->index_expression_);
  if (type_code != type_system_["int"]) {
    throw std::runtime_error("Non-int type expression in index");
  }

  NewScopeLayer* layer =
      current_layer_->GetArrayLayer(Symbol(expression->array_indent_));

  // -1 to get element type
  tos_value_ = layer->symbol_types_[Symbol(expression->array_indent_)] - 1;
}